

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O2

void ScaleVector(cupdlp_float weight,cupdlp_float *x,cupdlp_int n)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    x[uVar1] = x[uVar1] * weight;
  }
  return;
}

Assistant:

void ScaleVector(cupdlp_float weight, cupdlp_float *x, cupdlp_int n) {
#ifdef USE_MY_BLAS

  for (int i = 0; i < n; ++i) {
    x[i] *= weight;
  }

#else
  return ddot(n, x, incx, y, incy);
#endif
}